

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_reply.c
# Opt level: O1

int mpt_context_reply(mpt_reply_context *rc,int code,char *fmt,...)

{
  bool bVar1;
  char in_AL;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  undefined8 in_RCX;
  int type;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  mpt_msgtype mt;
  mpt_message msg;
  va_list va;
  iovec cont;
  char buf [256];
  undefined1 local_22a;
  char local_229;
  mpt_message local_228;
  undefined8 local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  iovec local_1e8;
  undefined1 local_1d8 [24];
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  char local_128 [255];
  undefined1 local_29;
  
  if (in_AL != '\0') {
    local_1a8 = in_XMM0_Qa;
    local_198 = in_XMM1_Qa;
    local_188 = in_XMM2_Qa;
    local_178 = in_XMM3_Qa;
    local_168 = in_XMM4_Qa;
    local_158 = in_XMM5_Qa;
    local_148 = in_XMM6_Qa;
    local_138 = in_XMM7_Qa;
  }
  local_229 = (char)code;
  if (local_229 != code) {
    return -1;
  }
  local_1c0 = in_RCX;
  local_1b8 = in_R8;
  local_1b0 = in_R9;
  if (rc != (mpt_reply_context *)0x0) {
    local_228.base = &local_22a;
    local_22a = 1;
    local_228.used = 2;
    local_228.clen = 0;
    if (fmt != (char *)0x0) {
      local_1f8 = local_1d8;
      local_200 = &stack0x00000008;
      local_208 = 0x3000000018;
      uVar2 = vsnprintf(local_128,0x100,fmt,&local_208);
      if (0 < (int)uVar2) {
        if (0x100 < (int)uVar2) {
          local_29 = 0;
          uVar2 = 0x100;
        }
        local_228.cont = &local_1e8;
        local_1e8.iov_len = (size_t)uVar2;
        local_228.clen = 1;
        local_1e8.iov_base = local_128;
      }
    }
    uVar2 = (*rc->_vptr->reply)(rc,&local_228);
    return (int)uVar2 >> 0x1f & uVar2;
  }
  if (fmt == (char *)0x0) {
    return 0;
  }
  type = 0x10;
  if (code != 0) {
    type = (uint)(0 < code) * 5 + 3;
  }
  iVar3 = fileno(_stderr);
  iVar3 = isatty(iVar3);
  bVar1 = true;
  if ((0 < iVar3) && (pcVar4 = mpt_ansi_code((uint8_t)type), pcVar4 != (char *)0x0)) {
    fputs(pcVar4,_stderr);
    bVar1 = false;
  }
  fputc(0x5b,_stderr);
  if (bVar1) {
    pcVar4 = mpt_log_identifier(type);
    if (pcVar4 != (char *)0x0) {
      fputs(pcVar4,_stderr);
    }
    fputc(0x3e,_stderr);
    fputc(0x5d,_stderr);
    fputc(0x20,_stderr);
    if (bVar1) goto LAB_0011326f;
  }
  else {
    mpt_context_reply_cold_1();
  }
  mpt_context_reply_cold_2();
LAB_0011326f:
  local_1f8 = local_1d8;
  local_200 = &stack0x00000008;
  local_208 = 0x3000000018;
  vfprintf(_stderr,fmt,&local_208);
  fputc(10,_stderr);
  return 1;
}

Assistant:

extern int mpt_context_reply(MPT_INTERFACE(reply_context) *rc, int code, const char *fmt, ...)
{
	va_list va;
	
	if (code < CHAR_MIN || code > CHAR_MAX) {
		return MPT_ERROR(BadArgument);
	}
	if (!rc) {
		const char *ansi = 0, *desc;
		
		if (!fmt) {
			return 0;
		}
		if (!code) {
			code = MPT_LOG(Debug);
		}
		else if (code > 0) {
			code = MPT_LOG(Info);
		}
		else {
			code = MPT_LOG(Error);
		}
		if ((isatty(fileno(stderr)) > 0) && (ansi = mpt_ansi_code(code))) {
			fputs(ansi, stderr);
		}
		fputc('[', stderr);
		if (!ansi && (desc = mpt_log_identifier(code))) {
			fputs(desc, stderr);
		}
		fputc('>', stderr);
		fputc(']', stderr);
		fputc(' ', stderr);
		
		if (ansi) {
			fputs(mpt_ansi_reset(), stderr);
		}
		va_start(va, fmt);
		vfprintf(stderr, fmt, va);
		va_end(va);
		fputc('\n', stderr);
		
		return 1;
	}
	else {
		char buf[256];
		MPT_STRUCT(message) msg;
		struct iovec cont;
		MPT_STRUCT(msgtype) mt;
		int ret;
		
		mt.cmd = MPT_MESGTYPE(Answer);
		mt.arg = code;
		
		msg.base = &mt;
		msg.used = sizeof(mt);
		msg.clen = 0;
		
		if (fmt) {
			int len;
			va_start(va, fmt);
			len = vsnprintf(buf, sizeof(buf), fmt, va);
			va_end(va);
			if (len > 0) {
				if (len > (int) sizeof(buf)) {
					len = sizeof(buf);
					buf[len-1] = 0;
				}
				cont.iov_base = buf;
				cont.iov_len  = len;
				msg.cont = &cont;
				msg.clen = 1;
			}
		}
		if ((ret = rc->_vptr->reply(rc, &msg)) < 0) {
			return ret;
		}
		return 0;
	}
}